

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::
serializedata<std::__cxx11::string_const,std::__cxx11::string_const,std::__cxx11::string_const,std::__cxx11::string_const,int_const>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,int *args_4)

{
  Options OVar1;
  string *in_RDI;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string *args_3_00;
  undefined7 in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_stack_fffffffffffffd20;
  Options *in_stack_fffffffffffffd30;
  ostream *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  ostringstream local_1a8 [424];
  
  args_3_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)
             CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38
             ,in_stack_fffffffffffffd30);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd08),args_3_00,(int *)in_RDI);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata((binarydata *)args_3_00,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x1e28e8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return (binarydata *)args_3_00;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }